

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

void update_volumes(YMZ280BVoice *voice)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = voice->pan;
  if (bVar1 == 8) {
    uVar2 = (uint)voice->level;
    voice->output_left = (uint)voice->level;
  }
  else {
    uVar2 = (uint)voice->level;
    if (bVar1 < 8) {
      voice->output_left = uVar2;
      if (bVar1 == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = ((bVar1 - 1) * uVar2) / 7;
      }
    }
    else {
      voice->output_left = (int)((0xf - (uint)bVar1) * uVar2) / 7;
    }
  }
  voice->output_right = uVar2;
  return;
}

Assistant:

INLINE void update_volumes(struct YMZ280BVoice *voice)
{
	if (voice->pan == 8)
	{
		voice->output_left = voice->level;
		voice->output_right = voice->level;
	}
	else if (voice->pan < 8)
	{
		voice->output_left = voice->level;

		/* pan 1 is hard-left, what's pan 0? for now assume same as pan 1 */
		voice->output_right = (voice->pan == 0) ? 0 : voice->level * (voice->pan - 1) / 7;
	}
	else
	{
		voice->output_left = voice->level * (15 - voice->pan) / 7;
		voice->output_right = voice->level;
	}
}